

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

void __thiscall cmCTestRunTest::MemCheckPostProcess(cmCTestRunTest *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  ostringstream cmCTestLog_msg;
  long *local_1a8;
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  if (this->TestHandler->MemCheck == true) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar1 = (ostream *)std::ostream::operator<<(local_188,this->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": process test output now: ",0x1b);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->TestProperties->Name)._M_dataplus._M_p,
                        (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->TestResult).Name._M_dataplus._M_p,
                        (this->TestResult).Name._M_string_length);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x164,(char *)local_1a8,(this->TestHandler->super_cmCTestGenericHandler).Quiet);
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
    cmCTestMemCheckHandler::PostProcessTest
              ((cmCTestMemCheckHandler *)this->TestHandler,&this->TestResult,this->Index);
  }
  return;
}

Assistant:

void cmCTestRunTest::MemCheckPostProcess()
{
  if (!this->TestHandler->MemCheck) {
    return;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     this->Index << ": process test output now: "
                                 << this->TestProperties->Name << " "
                                 << this->TestResult.Name << std::endl,
                     this->TestHandler->GetQuiet());
  cmCTestMemCheckHandler* handler =
    static_cast<cmCTestMemCheckHandler*>(this->TestHandler);
  handler->PostProcessTest(this->TestResult, this->Index);
}